

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosNetwork.cpp
# Opt level: O0

void __thiscall
adios2::helper::NetworkSocket::RequestResponse
          (NetworkSocket *this,string *request,char *response,size_t maxResponseSize)

{
  void *__buf;
  long in_RCX;
  void *in_RDX;
  long *in_RDI;
  size_t maxlen;
  size_t len;
  ssize_t result;
  int commRank;
  int __fd;
  undefined4 in_stack_fffffffffffffe7c;
  string *in_stack_fffffffffffffe80;
  string *in_stack_fffffffffffffe88;
  string *in_stack_fffffffffffffe90;
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [55];
  allocator local_59;
  string local_58 [32];
  size_t local_38;
  size_t local_30;
  ssize_t local_28;
  long local_20;
  void *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_30 = std::__cxx11::string::length();
  local_38 = local_20 - 1;
  __fd = *(int *)(*in_RDI + 0x10);
  __buf = (void *)std::__cxx11::string::c_str();
  local_28 = ::write(__fd,__buf,local_30);
  commRank = (int)((ulong)in_RDI >> 0x20);
  if (local_28 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"Helper",&local_59);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"helper:adiosNetwork",&local_91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"RequestResponse",&local_b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,"error: Cannot send request",&local_e1);
    Throw<std::ios_base::failure[abi:cxx11]>
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
               (string *)CONCAT44(in_stack_fffffffffffffe7c,__fd),commRank);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  local_28 = read(*(int *)(*in_RDI + 0x10),local_18,local_38);
  if (local_28 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"Helper",&local_109);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,"helper:adiosNetwork",&local_131);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_158,"RequestResponse",&local_159);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffe80,"error: Cannot get response",
               (allocator *)&stack0xfffffffffffffe7f);
    Throw<std::ios_base::failure[abi:cxx11]>
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
               (string *)CONCAT44(in_stack_fffffffffffffe7c,__fd),commRank);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe80);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe7f);
    std::__cxx11::string::~string(local_158);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
  }
  *(undefined1 *)((long)local_18 + local_28) = 0;
  return;
}

Assistant:

void NetworkSocket::RequestResponse(const std::string &request, char *response,
                                    size_t maxResponseSize)
{
#ifdef _WIN32
    int result;
    int len = static_cast<int>(request.length());
    int maxlen = static_cast<int>(maxResponseSize) - 1;
#else
    ssize_t result;
    size_t len = request.length();
    size_t maxlen = maxResponseSize - 1;
#endif
    result = write(m_Data->m_Socket, request.c_str(), len);
    if (result == -1)
    {
        helper::Throw<std::ios_base::failure>("Helper", "helper:adiosNetwork", "RequestResponse",
                                              "error: Cannot send request");
    }

    result = read(m_Data->m_Socket, response, maxlen);
    if (result == -1)
    {
        helper::Throw<std::ios_base::failure>("Helper", "helper:adiosNetwork", "RequestResponse",
                                              "error: Cannot get response");
    }
    // safely null terminate
    response[result] = '\0';
}